

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestallocationInstructionString::~TestallocationInstructionString
          (TestallocationInstructionString *this)

{
  TestallocationInstructionString *this_local;
  
  ~TestallocationInstructionString(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(allocationInstructionString)
{
  AllocationInstruction object;
  DataDictionary dataDictionary( "../spec/FIX44.xml" );

  object.setString
    ( "8=FIX.4.4\0019=198\00135=J\00134=1\00149=SENDER\00152=20170317-15:55:23.685\001"
      "56=TARGET\001627=2\001628=HOP1\001629=20170317-15:55:23.685\001630=1\001"
      "628=HOP2\001629=20170317-15:55:23.685\001630=2\0016=23.1\00153=100\001"
      "70=Alloc001\00171=0\00175=20170317\001626=1\001857=0\00110=196\001",
      true, &dataDictionary );

  FIX::SenderCompID senderCompID;
  FIX::TargetCompID targetCompID;
  FIX::SendingTime sendingTime;
  FIX::MsgSeqNum msgSeqNum;
  FIX::HopCompID hopCompID;
  FIX::HopSendingTime hopSendingTime;
  FIX::HopRefID hopRefID;

  CHECK_EQUAL( "SENDER", object.getHeader().get(senderCompID));
  CHECK_EQUAL( "TARGET", object.getHeader().get(targetCompID));
  CHECK_EQUAL( "20170317-15:55:23.685", object.getHeader().get(sendingTime).getString());
  CHECK_EQUAL( 1, object.getHeader().get(msgSeqNum));

  FIX44::Header::NoHops noHops;
  object.getHeader().getGroup( 1, noHops );
  CHECK_EQUAL( "HOP1", noHops.get(hopCompID) );
  CHECK_EQUAL( "20170317-15:55:23.685", noHops.getField(hopSendingTime).getString() );
  CHECK_EQUAL( 1, noHops.get(hopRefID) );

  object.getHeader().getGroup( 2, noHops );
  CHECK_EQUAL( "HOP2", noHops.get(hopCompID) );
  CHECK_EQUAL( "20170317-15:55:23.685", noHops.getField(hopSendingTime).getString() );
  CHECK_EQUAL( 2, noHops.get(hopRefID) );

  FIX::AllocID allocID;
  FIX::AllocTransType allocTransType;
  FIX::AllocType allocType;
  FIX::AllocNoOrdersType allocNoOrdersType;
  FIX::Quantity quantity;
  FIX::AvgPx avgPx;
  FIX::TradeDate tradeDate;
  CHECK_EQUAL( "Alloc001", object.get(allocID) );
  CHECK_EQUAL( AllocTransType_NEW, object.get(allocTransType) );
  CHECK_EQUAL( AllocType_CALCULATED, object.get(allocType) );
  CHECK_EQUAL( AllocNoOrdersType_NOT_SPECIFIED, object.get(allocNoOrdersType) );
  CHECK_EQUAL( 100, object.get(quantity) );
  CHECK_EQUAL( 23.1, object.get(avgPx) );
  CHECK_EQUAL( "20170317", object.get(tradeDate) );

  FIX::CheckSum checkSum;
  CHECK_EQUAL( 196, object.getTrailer().get(checkSum) );
}